

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

string * __thiscall
t_c_glib_generator::generate_hash_func_from_type_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype)

{
  uint uVar1;
  t_type *ttype_00;
  undefined8 uVar2;
  undefined8 *puVar3;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  t_base local_38;
  t_base tbase;
  allocator local_21;
  t_typedef *local_20;
  t_type *ttype_local;
  t_c_glib_generator *this_local;
  
  local_20 = (t_typedef *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_c_glib_generator *)__return_storage_ptr__;
  if (ttype == (t_type *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NULL",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[10])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0xd])();
        if (((uVar1 & 1) == 0) &&
           (uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0xb])(), (uVar1 & 1) == 0)) {
          uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[9])();
          if ((uVar1 & 1) == 0) {
            (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
            uVar2 = std::__cxx11::string::c_str();
            printf("Type not expected: %s\n",uVar2);
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = "Type not expected";
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          ttype_00 = t_typedef::get_type(local_20);
          generate_hash_func_from_type_abi_cxx11_(__return_storage_ptr__,this,ttype_00);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"g_direct_hash",&local_41);
          std::allocator<char>::~allocator((allocator<char> *)&local_41);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"g_direct_hash",&local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_40);
      }
    }
    else {
      local_38 = t_base_type::get_base((t_base_type *)local_20);
      switch(local_38) {
      case TYPE_VOID:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = "compiler error: cannot determine hash type";
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      case TYPE_STRING:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"g_str_hash",&local_3f);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f);
        break;
      case TYPE_BOOL:
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"thrift_boolean_hash",&local_39);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
        break;
      case TYPE_I8:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"thrift_int8_hash",&local_3a);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a);
        break;
      case TYPE_I16:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"thrift_int16_hash",&local_3b)
        ;
        std::allocator<char>::~allocator((allocator<char> *)&local_3b);
        break;
      case TYPE_I32:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"g_int_hash",&local_3c);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c);
        break;
      case TYPE_I64:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"g_int64_hash",&local_3d);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d);
        break;
      case TYPE_DOUBLE:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"g_double_hash",&local_3e);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e);
        break;
      default:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = "compiler error: no hash table info for type";
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::generate_hash_func_from_type(t_type* ttype) {
  if (ttype == nullptr)
    return "NULL";

  if (ttype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot determine hash type";
      break;
    case t_base_type::TYPE_BOOL:
      return "thrift_boolean_hash";
    case t_base_type::TYPE_I8:
      return "thrift_int8_hash";
    case t_base_type::TYPE_I16:
      return "thrift_int16_hash";
    case t_base_type::TYPE_I32:
      return "g_int_hash";
    case t_base_type::TYPE_I64:
      return "g_int64_hash";
    case t_base_type::TYPE_DOUBLE:
      return "g_double_hash";
    case t_base_type::TYPE_STRING:
      return "g_str_hash";
    default:
      throw "compiler error: no hash table info for type";
    }
  } else if (ttype->is_enum()) {
    return "g_direct_hash";
  } else if (ttype->is_container() || ttype->is_struct()) {
    return "g_direct_hash";
  } else if (ttype->is_typedef()) {
    return generate_hash_func_from_type(((t_typedef*)ttype)->get_type());
  }
  printf("Type not expected: %s\n", ttype->get_name().c_str());
  throw "Type not expected";
}